

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O3

bool dxil_spv::emit_create_handle_instruction(Impl *impl,CallInst *instruction)

{
  UnorderedSet<const_LLVMBC::CallInst_*> *this;
  ResourceType resource_type;
  bool bVar1;
  const_iterator cVar2;
  iterator __it;
  Value *instruction_offset;
  uint32_t resource_type_operand;
  uint32_t resource_range;
  uint32_t non_uniform;
  CallInst *local_48;
  uint local_3c;
  CallInst *local_38;
  uint32_t local_2c;
  
  local_48 = instruction;
  local_38 = instruction;
  if (((impl->options).descriptor_qa_enabled == true) &&
     ((impl->options).descriptor_qa_sink_handles != false)) {
    this = &impl->resource_handles_needing_sink;
    cVar2 = std::
            _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this->_M_h,&local_48);
    if (cVar2.super__Node_iterator_base<const_LLVMBC::CallInst_*,_false>._M_cur !=
        (__node_type *)0x0) {
      __it = std::
             _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&this->_M_h,&local_38);
      std::
      _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::erase(&this->_M_h,
              (const_iterator)__it.super__Node_iterator_base<const_LLVMBC::CallInst_*,_false>._M_cur
             );
      return true;
    }
  }
  bVar1 = get_constant_operand(&instruction->super_Instruction,1,(uint32_t *)&local_48);
  if ((bVar1) && (bVar1 = get_constant_operand(&instruction->super_Instruction,2,&local_3c), bVar1))
  {
    local_2c = 0;
    get_constant_operand(&instruction->super_Instruction,4,&local_2c);
    resource_type = (ResourceType)local_48;
    instruction_offset = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
    bVar1 = emit_create_handle(impl,instruction,resource_type,local_3c,instruction_offset,
                               local_2c != 0);
    return bVar1;
  }
  return false;
}

Assistant:

bool emit_create_handle_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (resource_handle_needs_sink(impl, instruction))
	{
		impl.resource_handles_needing_sink.erase(impl.resource_handles_needing_sink.find(instruction));
		return true;
	}

	uint32_t resource_type_operand, resource_range;

	if (!get_constant_operand(instruction, 1, &resource_type_operand))
		return false;
	if (!get_constant_operand(instruction, 2, &resource_range))
		return false;

	uint32_t non_uniform = 0;
	get_constant_operand(instruction, 4, &non_uniform);

	auto resource_type = static_cast<DXIL::ResourceType>(resource_type_operand);
	return emit_create_handle(impl, instruction, resource_type, resource_range,
	                          instruction->getOperand(3), non_uniform != 0);
}